

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O0

ScalarFunction * duckdb::RpadFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *func;
  allocator_type *in_stack_fffffffffffffdd8;
  BaseScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffde0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  LogicalType *local_1b8;
  BaseScalarFunction local_198 [176];
  LogicalType local_e8 [24];
  undefined1 local_d0 [32];
  LogicalType local_b0 [40];
  LogicalType *local_88;
  LogicalType local_80 [24];
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_88 = local_80;
  duckdb::LogicalType::LogicalType(local_88,VARCHAR);
  local_88 = local_68;
  duckdb::LogicalType::LogicalType(local_88,INTEGER);
  local_88 = local_50;
  duckdb::LogicalType::LogicalType(local_88,VARCHAR);
  local_38 = local_80;
  local_30 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe9885c);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffdf0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffde8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffdf4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffde0,iVar1,in_stack_fffffffffffffdd8);
  duckdb::LogicalType::LogicalType(local_b0,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
            );
  duckdb::LogicalType::LogicalType(local_e8,INVALID);
  function = (BaseScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_28,local_b0,local_d0,0);
  duckdb::LogicalType::~LogicalType(local_e8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe98936);
  duckdb::LogicalType::~LogicalType(local_b0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe98950);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe9895d);
  local_1b8 = (LogicalType *)&local_38;
  do {
    local_1b8 = local_1b8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_1b8);
  } while (local_1b8 != local_80);
  BaseScalarFunction::SetReturnsError(function);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_198);
  return in_RDI;
}

Assistant:

ScalarFunction RpadFun::GetFunction() {
	ScalarFunction func({LogicalType::VARCHAR, LogicalType::INTEGER, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                    PadFunction<RightPadOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}